

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void psset_alloc_container_insert(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  _Bool _Var2;
  pszind_t pVar3;
  
  ps->h_in_psset_alloc_container = true;
  if (ps->h_nactive != 0x200) {
    if (ps->h_nactive != 0) {
      pVar3 = psset_hpdata_heap_index(ps);
      _Var2 = duckdb_je_hpdata_age_heap_empty(psset->pageslabs + pVar3);
      if (_Var2) {
        psset->pageslab_bitmap[pVar3 >> 6] =
             psset->pageslab_bitmap[pVar3 >> 6] | 1L << ((byte)pVar3 & 0x3f);
      }
      duckdb_je_hpdata_age_heap_insert(psset->pageslabs + pVar3,ps);
      return;
    }
    (ps->field_13).ql_link_empty.qre_next = ps;
    (ps->field_13).ql_link_empty.qre_prev = ps;
    phVar1 = (psset->empty).head.qlh_first;
    if (phVar1 != (hpdata_t *)0x0) {
      (ps->field_13).age_link.link.prev = (phVar1->field_13).age_link.link.next;
      (((psset->empty).head.qlh_first)->field_13).ql_link_empty.qre_prev = ps;
      (ps->field_13).age_link.link.next =
           (((ps->field_13).ql_link_empty.qre_prev)->field_13).age_link.link.prev;
      phVar1 = (psset->empty).head.qlh_first;
      (((phVar1->field_13).ql_link_empty.qre_prev)->field_13).ql_link_empty.qre_next = phVar1;
      (((ps->field_13).ql_link_empty.qre_prev)->field_13).ql_link_empty.qre_next = ps;
    }
    (psset->empty).head.qlh_first = ps;
  }
  return;
}

Assistant:

static void
psset_alloc_container_insert(psset_t *psset, hpdata_t *ps) {
	assert(!hpdata_in_psset_alloc_container_get(ps));
	hpdata_in_psset_alloc_container_set(ps, true);
	if (hpdata_empty(ps)) {
		/*
		 * This prepend, paired with popping the head in psset_fit,
		 * means we implement LIFO ordering for the empty slabs set,
		 * which seems reasonable.
		 */
		hpdata_empty_list_prepend(&psset->empty, ps);
	} else if (hpdata_full(ps)) {
		/*
		 * We don't need to keep track of the full slabs; we're never
		 * going to return them from a psset_pick_alloc call.
		 */
	} else {
		psset_hpdata_heap_insert(psset, ps);
	}
}